

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QSize __thiscall QGraphicsView::sizeHint(QGraphicsView *this)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  QSize QVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QRectF local_68;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x498) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QVar4 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
      return QVar4;
    }
  }
  else {
    sceneRect(&local_68,this);
    QTransform::mapRect(&local_48);
    dVar5 = (double)(*(short *)(lVar1 + 0x26c) * 2);
    dVar6 = dVar5 + local_48.w;
    dVar5 = dVar5 + local_48.h;
    QGuiApplication::primaryScreen();
    uVar3 = QScreen::virtualSize();
    dVar7 = (double)(int)uVar3 * 3.0;
    dVar9 = (double)(int)((ulong)uVar3 >> 0x20) * 3.0;
    auVar10._0_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    auVar10._8_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar10 = minpd(_DAT_0066f5d0,auVar10);
    auVar10 = maxpd(auVar10,_DAT_0066f5e0);
    dVar7 = (double)(int)auVar10._0_8_ * 0.25;
    dVar9 = (double)(int)auVar10._8_8_ * 0.25;
    auVar11._0_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
    auVar11._8_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar10 = minpd(_DAT_0066f5d0,auVar11);
    auVar10 = maxpd(auVar10,_DAT_0066f5e0);
    auVar8._8_8_ = -(ulong)(dVar5 < (double)(int)auVar10._8_8_);
    auVar8._0_8_ = -(ulong)(dVar6 < (double)(int)auVar10._0_8_);
    uVar2 = movmskpd((int)uVar3,auVar8);
    if ((uVar2 & 1) == 0) {
      dVar6 = (double)(int)auVar10._0_8_;
    }
    if ((uVar2 & 2) == 0) {
      dVar5 = (double)(int)auVar10._8_8_;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
      dVar7 = 2147483647.0;
      if (dVar6 <= 2147483647.0) {
        dVar7 = dVar6;
      }
      if (dVar7 <= -2147483648.0) {
        dVar7 = -2147483648.0;
      }
      QVar4.wd.m_i = (int)dVar7;
      dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
      dVar6 = 2147483647.0;
      if (dVar5 <= 2147483647.0) {
        dVar6 = dVar5;
      }
      if (dVar6 <= -2147483648.0) {
        dVar6 = -2147483648.0;
      }
      QVar4.ht.m_i = (int)dVar6;
      return QVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSize QGraphicsView::sizeHint() const
{
    Q_D(const QGraphicsView);
    if (d->scene) {
        QSizeF baseSize = d->matrix.mapRect(sceneRect()).size();
        baseSize += QSizeF(d->frameWidth * 2, d->frameWidth * 2);
        return baseSize.boundedTo((3 * QGuiApplication::primaryScreen()->virtualSize()) / 4).toSize();
    }
    return QAbstractScrollArea::sizeHint();
}